

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O0

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::finished(barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,bool with_cell_counts)

{
  unsigned_short uVar1;
  ulong uVar2;
  unsigned_short uVar3;
  size_t sVar4;
  ostream *poVar5;
  void *pvVar6;
  size_type sVar7;
  reference pvVar8;
  int *piVar9;
  directed_flag_complex_in_memory_computer_t *this_00;
  byte in_SIL;
  int iVar10;
  long in_RDI;
  size_t i_1;
  size_t idx;
  int dim;
  bool computed_full_homology;
  size_t i;
  index_t cell_euler_characteristic;
  int in_stack_ffffffffffffff7c;
  directed_flag_complex_in_memory_computer_t *in_stack_ffffffffffffff80;
  bool local_4d;
  int local_38 [2];
  ulong local_30;
  ulong local_28;
  int local_20;
  bool local_19;
  ulong local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_10 = 0;
  if (local_9 != 0) {
    for (local_18 = 0; uVar2 = local_18,
        sVar4 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t
                ::top_dimension((directed_flag_complex_in_memory_computer_t *)0x1b73bc),
        uVar2 <= sVar4; local_18 = local_18 + 1) {
      iVar10 = 1;
      if ((local_18 & 1) == 1) {
        iVar10 = -1;
      }
      sVar4 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
              number_of_cells(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      local_10 = iVar10 * (int)sVar4 + local_10;
    }
    local_4d = false;
    if (*(short *)(in_RDI + 0x212) == 0) {
      uVar1 = *(unsigned_short *)(in_RDI + 0x214);
      uVar3 = std::numeric_limits<unsigned_short>::max();
      local_4d = uVar1 == uVar3;
    }
    local_19 = local_4d;
    if (local_4d != false) {
      std::ostream::operator<<((void *)(in_RDI + 8),std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)(in_RDI + 8),"# Euler characteristic: ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,local_10);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ostream::operator<<((void *)(in_RDI + 8),std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)(in_RDI + 8),"# Betti numbers:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  local_20 = 0;
  for (local_28 = 0; uVar2 = local_28,
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x218)),
      uVar2 < sVar7; local_28 = local_28 + 1) {
    poVar5 = std::operator<<((ostream *)(in_RDI + 8),"#\t\tdim H_");
    iVar10 = (uint)*(ushort *)(in_RDI + 0x212) + local_20;
    local_20 = local_20 + 1;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar10);
    poVar5 = std::operator<<(poVar5," = ");
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x218),
                        local_28);
    std::ostream::operator<<(poVar5,*pvVar8);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x230),
                        local_28);
    if (*pvVar8 != 0) {
      poVar5 = std::operator<<((ostream *)(in_RDI + 8)," (skipped ");
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x230),
                          local_28);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar8);
      std::operator<<(poVar5,")");
    }
    std::ostream::operator<<((void *)(in_RDI + 8),std::endl<char,std::char_traits<char>>);
  }
  if ((local_9 & 1) != 0) {
    std::ostream::operator<<((void *)(in_RDI + 8),std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)(in_RDI + 8),"# Cell counts:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_38[1] = 0;
    local_38[0] = *(ushort *)(in_RDI + 0x212) - 1;
    piVar9 = std::max<int>(local_38 + 1,local_38);
    for (local_30 = (ulong)*piVar9; uVar2 = local_30,
        sVar4 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t
                ::top_dimension((directed_flag_complex_in_memory_computer_t *)0x1b76be),
        uVar2 <= sVar4; local_30 = local_30 + 1) {
      poVar5 = std::operator<<((ostream *)(in_RDI + 8),"#\t\tdim C_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_30);
      this_00 = (directed_flag_complex_in_memory_computer_t *)std::operator<<(poVar5," = ");
      sVar4 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
              number_of_cells(this_00,in_stack_ffffffffffffff7c);
      pvVar6 = (void *)std::ostream::operator<<(this_00,sVar4);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void finished(bool with_cell_counts = true) {

		index_t cell_euler_characteristic = 0;
		if (with_cell_counts) {
			for (size_t i = 0; i <= complex->top_dimension(); i++)
				cell_euler_characteristic += (i % 2 == 1 ? -1 : 1) * index_t(complex->number_of_cells(index_t(i)));

			bool computed_full_homology =
			    min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
			if (computed_full_homology) {
				file_output_t<Complex>::outstream << std::endl;
				file_output_t<Complex>::outstream << "# Euler characteristic: " << cell_euler_characteristic
				                                  << std::endl;
			}
		}

		file_output_t<Complex>::outstream << std::endl;
		file_output_t<Complex>::outstream << "# Betti numbers:" << std::endl;
		int dim = 0;
		for (size_t idx = 0; idx < betti.size(); idx++) {
			file_output_t<Complex>::outstream << "#\t\tdim H_" << (min_dimension + dim++) << " = " << betti[idx];
			if (skipped[idx] > 0) file_output_t<Complex>::outstream << " (skipped " << skipped[idx] << ")";
			file_output_t<Complex>::outstream << std::endl;
		}

		if (with_cell_counts) {
			file_output_t<Complex>::outstream << std::endl;
			file_output_t<Complex>::outstream << "# Cell counts:" << std::endl;
			for (size_t i = size_t(std::max(0, min_dimension - 1)); i <= complex->top_dimension(); i++)
				file_output_t<Complex>::outstream << "#\t\tdim C_" << i << " = " << complex->number_of_cells(index_t(i))
				                                  << std::endl;
		}
	}